

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.h
# Opt level: O0

void __thiscall
clipp::documentation::documentation
          (documentation *this,group *cli,doc_formatting *fmt,filter_function *filter)

{
  int max;
  filter_function *filter_local;
  doc_formatting *fmt_local;
  group *cli_local;
  documentation *this_local;
  
  this->cli_ = cli;
  doc_formatting::doc_formatting(&this->fmt_,fmt);
  doc_formatting::doc_formatting(&this->usgFmt_,fmt);
  std::function<bool_(const_clipp::parameter_&)>::function(&this->filter_,filter);
  max = doc_formatting::max_flags_per_param_in_doc(&this->usgFmt_);
  doc_formatting::max_flags_per_param_in_usage(&this->usgFmt_,max);
  return;
}

Assistant:

documentation(const group& cli,
                  const doc_formatting& fmt = doc_formatting{},
                  filter_function filter = param_filter{})
    :
        cli_(cli), fmt_{fmt}, usgFmt_{fmt}, filter_{std::move(filter)}
    {
        //necessary, because we re-use "usage_lines" to generate
        //labels for documented groups
        usgFmt_.max_flags_per_param_in_usage(
            usgFmt_.max_flags_per_param_in_doc());
    }